

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveOut::out<myEmployee>
          (ChArchiveOut *this,
          ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *bVal)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_> specVal;
  char buffer [20];
  ChNameValue<myEmployee> local_98;
  ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_> local_80;
  char local_48 [24];
  
  ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::ChValueSpecific
            (&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_80,
             (long)(bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 6);
  if ((bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      sprintf(local_48,"%lu",uVar3);
      local_98._value =
           (myEmployee *)
           ((long)&((bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                    _M_impl.super__Vector_impl_data._M_start)->_vptr_myEmployee + lVar2);
      local_98._flags = '\0';
      local_98._name = local_48;
      out<myEmployee>(this,&local_98);
      (*(this->super_ChArchive)._vptr_ChArchive[0xf])
                (this,&local_80,
                 (long)(bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 6);
      uVar3 = uVar3 + 1;
      uVar1 = (long)(bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(bVal->_value->super__Vector_base<myEmployee,_std::allocator<myEmployee>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 6;
      lVar2 = lVar2 + 0x40;
    } while (uVar3 < uVar1);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80,uVar1);
  local_80.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00158650;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.super_ChValue._name._M_dataplus._M_p != &local_80.super_ChValue._name.field_2) {
    operator_delete(local_80.super_ChValue._name._M_dataplus._M_p,
                    local_80.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out     (ChNameValue< std::vector<T> > bVal) {
          ChValueSpecific< std::vector<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          for (size_t i = 0; i<bVal.value().size(); ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }